

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

boolean clear_path(int col1,int row1,int col2,int row2)

{
  int iVar1;
  undefined1 local_1c;
  int result;
  int row2_local;
  int col2_local;
  int row1_local;
  int col1_local;
  
  if (col1 < col2) {
    if (row2 < row1) {
      iVar1 = q1_path(row1,col1,row2,col2);
      local_1c = (boolean)iVar1;
    }
    else {
      iVar1 = q4_path(row1,col1,row2,col2);
      local_1c = (boolean)iVar1;
    }
  }
  else if (row2 < row1) {
    iVar1 = q2_path(row1,col1,row2,col2);
    local_1c = (boolean)iVar1;
  }
  else if ((row1 == row2) && (col1 == col2)) {
    local_1c = '\x01';
  }
  else {
    iVar1 = q3_path(row1,col1,row2,col2);
    local_1c = (boolean)iVar1;
  }
  return local_1c;
}

Assistant:

boolean clear_path(int col1, int row1, int col2, int row2)
{
    int result;

    if (col1 < col2) {
	if (row1 > row2) {
	    result = q1_path(row1,col1,row2,col2);
	} else {
	    result = q4_path(row1,col1,row2,col2);
	}
    } else {
	if (row1 > row2) {
	    result = q2_path(row1,col1,row2,col2);
	} else if (row1 == row2 && col1 == col2) {
	    result = 1;
	} else {
	    result = q3_path(row1,col1,row2,col2);
	}
    }
    return (boolean)result;
}